

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O2

void __thiscall
qclab::qgates::RotationX<std::complex<double>_>::RotationX
          (RotationX<std::complex<double>_> *this,real_type theta)

{
  QRotationGate1<std::complex<double>_>::QRotationGate1
            (&this->super_QRotationGate1<std::complex<double>_>,0,theta,false);
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00121548;
  return;
}

Assistant:

RotationX( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }